

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

uint64_t pstore::milliseconds_since_epoch(void)

{
  uint64_t uVar1;
  rep result;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> ms;
  duration<long,_std::ratio<1L,_1000000000L>_> local_10;
  duration dur;
  
  ms.__r = std::chrono::_V2::system_clock::now();
  local_10.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&ms);
  result = (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_10);
  uVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000L>_> *)&result);
  if (-1 < (long)uVar1) {
    return uVar1;
  }
  assert_failed("result >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/time.cpp"
                ,0x2c);
}

Assistant:

std::uint64_t milliseconds_since_epoch () {
        using namespace std::chrono;
        system_clock::duration const dur = system_clock::now ().time_since_epoch ();
        auto const ms = duration_cast<milliseconds> (dur);

        using rep = milliseconds::rep;
        using urep = std::make_unsigned<rep>::type;

        rep const result = ms.count ();
        PSTORE_ASSERT (result >= 0);

        static_assert (type_max<rep> () >= 0 &&
                           type_max<rep, urep> () <= type_max<std::uint64_t> (),
                       "millisecond representation is too wide for uint64");
        return static_cast<std::uint64_t> (result);
    }